

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxCompareEq::Resolve(FxCompareEq *this,FCompileContext *ctx)

{
  BYTE BVar1;
  FxExpression *pFVar2;
  PPointer *dest;
  PPointer *source;
  PInt *pPVar3;
  PString *pPVar4;
  PClass *pPVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PType *pPVar9;
  undefined4 extraout_var_05;
  FxExpression *pFVar10;
  FxBoolCast *pFVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  char *pcVar12;
  char *pcVar13;
  undefined4 uVar14;
  FScriptPosition *pFVar15;
  undefined4 uVar16;
  PString **this_00;
  bool bVar17;
  anon_union_8_3_addc324a_for_ExpVal_1 aVar18;
  FString v1;
  FString v2;
  PInt *local_68;
  anon_union_8_3_addc324a_for_ExpVal_1 local_60;
  undefined1 local_58 [16];
  anon_union_8_3_addc324a_for_ExpVal_1 local_48;
  undefined8 uStack_40;
  anon_union_8_3_addc324a_for_ExpVal_1 local_38;
  
  if ((this->super_FxBinary).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  pFVar10 = (this->super_FxBinary).left;
  if (pFVar10 != (FxExpression *)0x0) {
    iVar6 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar6);
  }
  pFVar10 = (this->super_FxBinary).right;
  if (pFVar10 != (FxExpression *)0x0) {
    iVar6 = (*pFVar10->_vptr_FxExpression[2])(pFVar10,ctx);
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar6);
  }
  pPVar5 = PClassPointer::RegistrationInfo.MyClass;
  pFVar10 = (this->super_FxBinary).left;
  if ((pFVar10 == (FxExpression *)0x0) ||
     (pFVar2 = (this->super_FxBinary).right, pFVar2 == (FxExpression *)0x0)) goto LAB_0052ad2a;
  pPVar9 = pFVar10->ValueType;
  this_00 = (PString **)pFVar2->ValueType;
  if (pPVar9 == (PType *)this_00) {
LAB_0052ab20:
    (this->super_FxBinary).super_FxExpression.ValueType = pPVar9;
LAB_0052ab24:
    if (((this->super_FxBinary).Operator != 0x121) ||
       (((this->super_FxBinary).super_FxExpression.ValueType)->RegType - 1 < 2)) {
      iVar6 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if (((char)iVar6 == '\0') ||
         (iVar6 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (char)iVar6 == '\0'))
      {
        if ((this->super_FxBinary).Operator == 0x121) goto LAB_0052b4ba;
        iVar6 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
        if ((char)iVar6 != '\0') {
          pFVar10 = (this->super_FxBinary).left;
          BVar1 = pFVar10->ValueType->RegType;
          if (BVar1 == '\x03') {
            pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
            this_00 = &TypeString;
            if (pPVar4 == TypeString) {
              FString::AttachToOther((FString *)&local_60,&pFVar10[1].ScriptPosition.FileName);
            }
            else {
              local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                         pFVar10[1].ScriptPosition.FileName.Chars;
            }
            BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
            bVar17 = (char *)local_60.pointer == (char *)0x0;
            if (pPVar4 == TypeString) {
              FString::~FString((FString *)&local_60);
            }
            bVar17 = BVar1 != '\x03' || bVar17;
          }
          else {
            if (BVar1 == '\x01') {
              if (pFVar10->ValueType->RegCount != '\x01') {
                __assert_fail("left->ValueType->GetRegCount() == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                              ,0xd83,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)"
                             );
              }
              local_68 = (PInt *)pFVar10[1]._vptr_FxExpression;
              if (local_68 == (PInt *)TypeString) {
                FString::AttachToOther((FString *)&local_60,&pFVar10[1].ScriptPosition.FileName);
              }
              else {
                local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                           pFVar10[1].ScriptPosition.FileName.Chars;
              }
              aVar18 = local_60;
              if ((local_68->field_0x6b != '\x01') &&
                 (aVar18.Float = 0.0, local_68->field_0x6b == '\0')) {
                if (local_68 == TypeUInt32) {
                  aVar18.Float = (double)((ulong)local_60.pointer & 0xffffffff);
                }
                else {
                  aVar18.Float = (double)local_60.Int;
                }
              }
              bVar17 = aVar18.Float == 0.0;
            }
            else {
              if (BVar1 != '\0') {
                bVar17 = false;
                goto LAB_0052b1c0;
              }
              local_68 = (PInt *)pFVar10[1]._vptr_FxExpression;
              if (local_68 == (PInt *)TypeString) {
                FString::AttachToOther((FString *)&local_60,&pFVar10[1].ScriptPosition.FileName);
              }
              else {
                local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                           pFVar10[1].ScriptPosition.FileName.Chars;
              }
              if (local_68->field_0x6b == '\x01') {
                uVar14 = (undefined4)local_60.Float;
              }
              else {
                uVar14 = 0;
                if (local_68->field_0x6b == '\0') {
                  uVar14 = local_60.Int;
                }
              }
              bVar17 = uVar14 == 0;
            }
            this_00 = &TypeString;
            if (local_68 == (PInt *)TypeString) {
              FString::~FString((FString *)&local_60);
            }
          }
LAB_0052b1c0:
          if (bVar17) {
            if ((this->super_FxBinary).Operator == 0x11f) {
              pFVar11 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x30);
              pFVar10 = (this->super_FxBinary).right;
              (pFVar11->super_FxExpression)._vptr_FxExpression =
                   (_func_int **)&PTR__FxExpression_00711370;
              FScriptPosition::FScriptPosition
                        (&(pFVar11->super_FxExpression).ScriptPosition,&pFVar10->ScriptPosition);
              (pFVar11->super_FxExpression).ValueType = (PType *)0x0;
              (pFVar11->super_FxExpression).isresolved = false;
              (pFVar11->super_FxExpression).NeedResult = true;
              (pFVar11->super_FxExpression).ExprType = EFX_UnaryNotBoolean;
              (pFVar11->super_FxExpression)._vptr_FxExpression =
                   (_func_int **)&PTR__FxUnaryNotBoolean_0070f9c0;
              pFVar11->basex = pFVar10;
            }
            else {
              pFVar11 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
              FxBoolCast::FxBoolCast(pFVar11,(this->super_FxBinary).right,true);
            }
            (this->super_FxBinary).right = (FxExpression *)0x0;
            (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
            iVar6 = (*(pFVar11->super_FxExpression)._vptr_FxExpression[2])(pFVar11,ctx);
            this_00 = (PString **)CONCAT44(extraout_var_06,iVar6);
          }
          if (bVar17) {
            return (FxExpression *)(PType *)this_00;
          }
        }
        iVar6 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
        if ((char)iVar6 == '\0') goto LAB_0052b4ba;
        pFVar10 = (this->super_FxBinary).right;
        BVar1 = pFVar10->ValueType->RegType;
        if (BVar1 == '\x03') {
          pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
          if (pPVar4 == TypeString) {
            FString::AttachToOther((FString *)&local_60,&pFVar10[1].ScriptPosition.FileName);
          }
          else {
            local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                       pFVar10[1].ScriptPosition.FileName.Chars;
          }
          BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
          bVar17 = (char *)local_60.pointer == (char *)0x0;
          if (pPVar4 == TypeString) {
            FString::~FString((FString *)&local_60);
          }
          bVar17 = BVar1 != '\x03' || bVar17;
        }
        else {
          if (BVar1 == '\x01') {
            if (pFVar10->ValueType->RegCount != '\x01') {
              __assert_fail("right->ValueType->GetRegCount() == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                            ,0xda3,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
            }
            local_68 = (PInt *)pFVar10[1]._vptr_FxExpression;
            if (local_68 == (PInt *)TypeString) {
              FString::AttachToOther((FString *)&local_60,&pFVar10[1].ScriptPosition.FileName);
            }
            else {
              local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                         pFVar10[1].ScriptPosition.FileName.Chars;
            }
            aVar18 = local_60;
            if ((local_68->field_0x6b != '\x01') &&
               (aVar18.Float = 0.0, local_68->field_0x6b == '\0')) {
              if (local_68 == TypeUInt32) {
                aVar18.Float = (double)((ulong)local_60.pointer & 0xffffffff);
              }
              else {
                aVar18.Float = (double)local_60.Int;
              }
            }
            bVar17 = aVar18.Float == 0.0;
          }
          else {
            if (BVar1 != '\0') {
              bVar17 = false;
              goto LAB_0052b404;
            }
            local_68 = (PInt *)pFVar10[1]._vptr_FxExpression;
            if (local_68 == (PInt *)TypeString) {
              FString::AttachToOther((FString *)&local_60,&pFVar10[1].ScriptPosition.FileName);
            }
            else {
              local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)
                         pFVar10[1].ScriptPosition.FileName.Chars;
            }
            if (local_68->field_0x6b == '\x01') {
              uVar14 = (undefined4)local_60.Float;
            }
            else {
              uVar14 = 0;
              if (local_68->field_0x6b == '\0') {
                uVar14 = local_60.Int;
              }
            }
            bVar17 = uVar14 == 0;
          }
          if (local_68 == (PInt *)TypeString) {
            FString::~FString((FString *)&local_60);
          }
        }
LAB_0052b404:
        if (bVar17) {
          if ((this->super_FxBinary).Operator == 0x11f) {
            pFVar11 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x30);
            pFVar10 = (this->super_FxBinary).left;
            (pFVar11->super_FxExpression)._vptr_FxExpression =
                 (_func_int **)&PTR__FxExpression_00711370;
            FScriptPosition::FScriptPosition
                      (&(pFVar11->super_FxExpression).ScriptPosition,&pFVar10->ScriptPosition);
            (pFVar11->super_FxExpression).ValueType = (PType *)0x0;
            (pFVar11->super_FxExpression).isresolved = false;
            (pFVar11->super_FxExpression).NeedResult = true;
            (pFVar11->super_FxExpression).ExprType = EFX_UnaryNotBoolean;
            (pFVar11->super_FxExpression)._vptr_FxExpression =
                 (_func_int **)&PTR__FxUnaryNotBoolean_0070f9c0;
            pFVar11->basex = pFVar10;
          }
          else {
            pFVar11 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
            FxBoolCast::FxBoolCast(pFVar11,(this->super_FxBinary).left,true);
          }
          (this->super_FxBinary).left = (FxExpression *)0x0;
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
          iVar6 = (*(pFVar11->super_FxExpression)._vptr_FxExpression[2])(pFVar11,ctx);
          this_00 = (PString **)CONCAT44(extraout_var_07,iVar6);
        }
        if (bVar17) {
          return (FxExpression *)(PType *)this_00;
        }
LAB_0052b4ba:
        (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
        return (FxExpression *)this;
      }
      pPVar9 = (this->super_FxBinary).super_FxExpression.ValueType;
      if (pPVar9 == (PType *)TypeString) {
        pFVar10 = (this->super_FxBinary).left;
        pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
        pFVar15 = &pFVar10[1].ScriptPosition;
        if (pPVar4 == TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar15->FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar15->FileName).Chars;
        }
        ExpVal::GetString((ExpVal *)local_58);
        if (pPVar4 == TypeString) {
          FString::~FString((FString *)&local_60);
        }
        pFVar10 = (this->super_FxBinary).right;
        pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
        pFVar15 = &pFVar10[1].ScriptPosition;
        if (pPVar4 == TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar15->FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar15->FileName).Chars;
        }
        ExpVal::GetString((ExpVal *)(local_58 + 8));
        if (pPVar4 == TypeString) {
          FString::~FString((FString *)&local_60);
        }
        iVar6 = (this->super_FxBinary).Operator;
        if (iVar6 == 0x121) {
          iVar6 = strcasecmp((char *)local_58._0_8_,(char *)local_58._8_8_);
          bVar17 = iVar6 == 0;
        }
        else {
          iVar7 = strcmp((char *)local_58._0_8_,(char *)local_58._8_8_);
          bVar17 = (iVar6 == 0x11f) != (iVar7 != 0);
        }
        FString::~FString((FString *)(local_58 + 8));
        FString::~FString((FString *)local_58);
      }
      else if (pPVar9->RegType == '\x01') {
        pFVar10 = (this->super_FxBinary).left;
        pPVar3 = (PInt *)pFVar10[1]._vptr_FxExpression;
        pFVar15 = &pFVar10[1].ScriptPosition;
        if (pPVar3 == (PInt *)TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar15->FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar15->FileName).Chars;
        }
        local_48 = local_60;
        if ((pPVar3->field_0x6b != '\x01') && (local_48.Float = 0.0, pPVar3->field_0x6b == '\0')) {
          if (pPVar3 == TypeUInt32) {
            local_48.Float = (double)((ulong)local_60.pointer & 0xffffffff);
          }
          else {
            local_48.Float = (double)local_60.Int;
          }
        }
        uStack_40 = 0;
        if (pPVar3 == (PInt *)TypeString) {
          FString::~FString((FString *)&local_60);
        }
        pFVar10 = (this->super_FxBinary).right;
        pPVar3 = (PInt *)pFVar10[1]._vptr_FxExpression;
        pFVar15 = &pFVar10[1].ScriptPosition;
        if (pPVar3 == (PInt *)TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar15->FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar15->FileName).Chars;
        }
        aVar18 = local_60;
        if ((pPVar3->field_0x6b != '\x01') && (aVar18.Float = 0.0, pPVar3->field_0x6b == '\0')) {
          if (pPVar3 == TypeUInt32) {
            aVar18.Float = (double)((ulong)local_60.pointer & 0xffffffff);
          }
          else {
            aVar18.Float = (double)local_60.Int;
          }
        }
        if (pPVar3 == (PInt *)TypeString) {
          local_38 = aVar18;
          FString::~FString((FString *)&local_60);
          aVar18 = local_38;
        }
        iVar6 = (this->super_FxBinary).Operator;
        if (iVar6 == 0x120) {
          bVar17 = local_48.Float != aVar18.Float;
        }
        else {
          if (iVar6 != 0x11f) {
            bVar17 = ABS(local_48.Float - aVar18.Float) < 1.52587890625e-05;
            goto LAB_0052b10f;
          }
          bVar17 = local_48.Float == aVar18.Float;
        }
        bVar17 = (bool)(-bVar17 & 1);
      }
      else {
        pFVar10 = (this->super_FxBinary).left;
        pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
        pFVar15 = &pFVar10[1].ScriptPosition;
        if (pPVar4 == TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar15->FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar15->FileName).Chars;
        }
        BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          uVar14 = (undefined4)local_60.Float;
        }
        else {
          uVar14 = 0;
          if (BVar1 == '\0') {
            uVar14 = local_60.Int;
          }
        }
        if (pPVar4 == TypeString) {
          FString::~FString((FString *)&local_60);
        }
        pFVar10 = (this->super_FxBinary).right;
        pPVar4 = (PString *)pFVar10[1]._vptr_FxExpression;
        pFVar15 = &pFVar10[1].ScriptPosition;
        if (pPVar4 == TypeString) {
          FString::AttachToOther((FString *)&local_60,&pFVar15->FileName);
        }
        else {
          local_60 = (anon_union_8_3_addc324a_for_ExpVal_1)(pFVar15->FileName).Chars;
        }
        BVar1 = (pPVar4->super_PBasicType).super_PType.RegType;
        if (BVar1 == '\x01') {
          uVar16 = (undefined4)local_60.Float;
        }
        else {
          uVar16 = 0;
          if (BVar1 == '\0') {
            uVar16 = local_60.Int;
          }
        }
        if (pPVar4 == TypeString) {
          FString::~FString((FString *)&local_60);
        }
        bVar17 = (uVar14 != uVar16) != ((this->super_FxBinary).Operator == 0x11f);
      }
LAB_0052b10f:
      pFVar10 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar10->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&pFVar10->ScriptPosition,&(this->super_FxBinary).super_FxExpression.ScriptPosition)
      ;
      pFVar10->ValueType = (PType *)0x0;
      *(undefined2 *)&pFVar10->isresolved = 0x100;
      pFVar10->ExprType = EFX_Constant;
      pFVar10->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
      pPVar3 = TypeSInt32;
      *(PInt **)(pFVar10 + 1) = TypeSInt32;
      pFVar10->ValueType = (PType *)pPVar3;
      *(uint *)&pFVar10[1].ScriptPosition = (uint)bVar17;
      pFVar10->isresolved = true;
      goto LAB_0052b17a;
    }
  }
  else {
    if (pPVar9 == (PType *)TypeName || pPVar9 == (PType *)TypeString) {
      if ((((PName *)this_00 != TypeName) && ((PSound *)this_00 != TypeSound)) &&
         ((PColor *)this_00 != TypeColor)) {
        if ((((PBasicType *)&((PType *)this_00)->super_PTypeBase)->super_PType).super_PTypeBase.
            super_DObject.Class == (PClass *)0x0) {
          iVar6 = (**(((PBasicType *)&((PType *)this_00)->super_PTypeBase)->super_PType).
                     super_PTypeBase.super_DObject._vptr_DObject)(this_00);
          (((PBasicType *)&((PType *)this_00)->super_PTypeBase)->super_PType).super_PTypeBase.
          super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar6);
        }
        pPVar8 = (((PBasicType *)&((PType *)this_00)->super_PTypeBase)->super_PType).super_PTypeBase
                 .super_DObject.Class;
        bVar17 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar5 && bVar17) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar17 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar5) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if ((!bVar17) && (((this->super_FxBinary).right)->ValueType != (PType *)TypeStateLabel))
        goto LAB_0052a918;
      }
      this_00 = (PString **)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                ((FxTypeCast *)this_00,(this->super_FxBinary).left,
                 ((this->super_FxBinary).right)->ValueType,false,true);
      (this->super_FxBinary).left = (FxExpression *)this_00;
      iVar6 = (*((FxExpression *)&((PType *)this_00)->super_PTypeBase)->_vptr_FxExpression[2])
                        (this_00,ctx);
      (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var_02,iVar6);
      if ((FxExpression *)CONCAT44(extraout_var_02,iVar6) == (FxExpression *)0x0) goto LAB_0052ad2a;
      pFVar10 = (this->super_FxBinary).right;
LAB_0052ab1c:
      pPVar9 = pFVar10->ValueType;
      goto LAB_0052ab20;
    }
LAB_0052a918:
    pPVar9 = ((this->super_FxBinary).right)->ValueType;
    if ((pPVar9 == (PType *)TypeName || pPVar9 == (PType *)TypeString) &&
       (((pPVar9 = ((this->super_FxBinary).left)->ValueType, pPVar9 == (PType *)TypeName ||
         (pPVar9 == (PType *)TypeSound)) ||
        ((pPVar9 == (PType *)TypeColor ||
         ((bVar17 = DObject::IsKindOf((DObject *)pPVar9,PClassPointer::RegistrationInfo.MyClass),
          bVar17 || (((this->super_FxBinary).left)->ValueType == (PType *)TypeStateLabel)))))))) {
      this_00 = (PString **)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                ((FxTypeCast *)this_00,(this->super_FxBinary).right,
                 ((this->super_FxBinary).left)->ValueType,false,true);
      (this->super_FxBinary).right = (FxExpression *)this_00;
      iVar6 = (*((FxExpression *)&((PType *)this_00)->super_PTypeBase)->_vptr_FxExpression[2])
                        (this_00,ctx);
      (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_04,iVar6);
      if ((FxExpression *)CONCAT44(extraout_var_04,iVar6) == (FxExpression *)0x0) goto LAB_0052ad2a;
      pFVar10 = (this->super_FxBinary).left;
      goto LAB_0052ab1c;
    }
    iVar6 = (*(((this->super_FxBinary).left)->ValueType->super_PTypeBase).super_DObject.
              _vptr_DObject[8])();
    if (((char)iVar6 != '\0') &&
       (iVar6 = (*(((this->super_FxBinary).right)->ValueType->super_PTypeBase).super_DObject.
                  _vptr_DObject[8])(), (char)iVar6 != '\0')) {
      FxBinary::Promote(&this->super_FxBinary,ctx,false);
      goto LAB_0052ab24;
    }
    dest = (PPointer *)((this->super_FxBinary).left)->ValueType;
    if ((dest == (PPointer *)TypeStateLabel) &&
       ((PPointer *)((this->super_FxBinary).right)->ValueType == TypeNullPtr)) {
      this_00 = (PString **)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                ((FxTypeCast *)this_00,(this->super_FxBinary).right,(PType *)TypeStateLabel,false,
                 false);
      (this->super_FxBinary).right = (FxExpression *)this_00;
      iVar6 = (*((FxExpression *)&((PType *)this_00)->super_PTypeBase)->_vptr_FxExpression[2])
                        (this_00,ctx);
      pFVar10 = (FxExpression *)CONCAT44(extraout_var_05,iVar6);
      (this->super_FxBinary).right = pFVar10;
LAB_0052ad21:
      if (pFVar10 == (FxExpression *)0x0) {
LAB_0052ad2a:
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
        return (FxExpression *)0x0;
      }
      goto LAB_0052ab24;
    }
    source = (PPointer *)((this->super_FxBinary).right)->ValueType;
    if ((source == (PPointer *)TypeStateLabel) && (dest == TypeNullPtr)) {
      this_00 = (PString **)FMemArena::Alloc(&FxAlloc,0x38);
      FxTypeCast::FxTypeCast
                ((FxTypeCast *)this_00,(this->super_FxBinary).left,(PType *)TypeStateLabel,false,
                 false);
      (this->super_FxBinary).left = (FxExpression *)this_00;
      iVar6 = (*((FxExpression *)&((PType *)this_00)->super_PTypeBase)->_vptr_FxExpression[2])
                        (this_00,ctx);
      pFVar10 = (FxExpression *)CONCAT44(extraout_var_03,iVar6);
      (this->super_FxBinary).left = pFVar10;
      goto LAB_0052ad21;
    }
    if ((((dest->super_PBasicType).super_PType.RegType == '\x03') &&
        ((source->super_PBasicType).super_PType.RegType == '\x03')) &&
       ((dest == source ||
        ((dest == TypeNullPtr || source == TypeNullPtr ||
         (bVar17 = AreCompatiblePointerTypes((PType *)dest,(PType *)source,true), bVar17))))))
    goto LAB_0052ab24;
  }
  iVar6 = (this->super_FxBinary).Operator;
  pcVar13 = "~==";
  if (iVar6 == 0x120) {
    pcVar13 = "!=";
  }
  pcVar12 = "==";
  if (iVar6 != 0x11f) {
    pcVar12 = pcVar13;
  }
  pFVar10 = (FxExpression *)0x0;
  FScriptPosition::Message
            (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
             "Incompatible operands for %s comparison",pcVar12);
LAB_0052b17a:
  (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])(this);
  return pFVar10;
}

Assistant:

FxExpression *FxCompareEq::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType != right->ValueType)	// identical types are always comparable, if they can be placed in a register, so we can save most checks if this is the case.
	{
		// Special cases: Compare strings and names with names, sounds, colors, state labels and class types.
		// These are all types a string can be implicitly cast into, so for convenience, so they should when doing a comparison.
		if ((left->ValueType == TypeString || left->ValueType == TypeName) &&
			(right->ValueType == TypeName || right->ValueType == TypeSound || right->ValueType == TypeColor || right->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || right->ValueType == TypeStateLabel))
		{
			left = new FxTypeCast(left, right->ValueType, false, true);
			left = left->Resolve(ctx);
			ABORT(left);
			ValueType = right->ValueType;
		}
		else if ((right->ValueType == TypeString || right->ValueType == TypeName) &&
			(left->ValueType == TypeName || left->ValueType == TypeSound || left->ValueType == TypeColor || left->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || left->ValueType == TypeStateLabel))
		{
			right = new FxTypeCast(right, left->ValueType, false, true);
			right = right->Resolve(ctx);
			ABORT(right);
			ValueType = left->ValueType;
		}
		else if (left->IsNumeric() && right->IsNumeric())
		{
			Promote(ctx);
		}
		// allows comparing state labels with null pointers.
		else if (left->ValueType == TypeStateLabel && right->ValueType == TypeNullPtr)
		{
			right = new FxTypeCast(right, TypeStateLabel, false);
			SAFE_RESOLVE(right, ctx);
		}
		else if (right->ValueType == TypeStateLabel && left->ValueType == TypeNullPtr)
		{
			left = new FxTypeCast(left, TypeStateLabel, false);
			SAFE_RESOLVE(left, ctx);
		}
		else if (left->ValueType->GetRegType() == REGT_POINTER && right->ValueType->GetRegType() == REGT_POINTER)
		{
			if (left->ValueType != right->ValueType && right->ValueType != TypeNullPtr && left->ValueType != TypeNullPtr &&
				!AreCompatiblePointerTypes(left->ValueType, right->ValueType, true))
			{
				goto error;
			}
		}
		else
		{
			goto error;
		}
	}
	else if (left->ValueType->GetRegType() == REGT_NIL)
	{
		goto error;
	}
	else
	{
		ValueType = left->ValueType;
	}

	if (Operator == TK_ApproxEq && ValueType->GetRegType() != REGT_FLOAT && ValueType->GetRegType() != REGT_STRING)
	{
		// Only floats, vectors and strings have handling for '~==', for all other types this is an error.
		goto error;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v;

		if (ValueType == TypeString)
		{
			FString v1 = static_cast<FxConstant *>(left)->GetValue().GetString();
			FString v2 = static_cast<FxConstant *>(right)->GetValue().GetString();
			if (Operator == TK_ApproxEq) v = !v1.CompareNoCase(v2);
			else
			{
				v = !!v1.Compare(v2);
				if (Operator == TK_Eq) v = !v;
			}
		}
		else if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();
			v = Operator == TK_Eq? v1 == v2 : Operator == TK_Neq? v1 != v2 : fabs(v1-v2) < VM_EPSILON;
		}
		else
		{
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();
			v = Operator == TK_Eq? v1 == v2 : v1 != v2;
		}
		FxExpression *e = new FxConstant(v, ScriptPosition);
		delete this;
		return e;
	}
	else
	{
		// also simplify comparisons against zero. For these a bool cast/unary not on the other value will do just as well and create better code.
		if (Operator != TK_ApproxEq)
		{
			if (left->isConstant())
			{
				bool leftisnull;
				switch (left->ValueType->GetRegType())
				{
				case REGT_INT:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(left->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetPointer() == nullptr;
					break;

				default:
					leftisnull = false;
				}
				if (leftisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(right);
					else x = new FxBoolCast(right);
					right = nullptr;
					delete this;
					return x->Resolve(ctx);
				}

			}
			if (right->isConstant())
			{
				bool rightisnull;
				switch (right->ValueType->GetRegType())
				{
				case REGT_INT:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(right->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetPointer() == nullptr;
					break;

				default:
					rightisnull = false;
				}
				if (rightisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(left);
					else x = new FxBoolCast(left);
					left = nullptr;
					delete this;
					return x->Resolve(ctx);
				}
			}
		}
	}
	ValueType = TypeBool;
	return this;

error:
	ScriptPosition.Message(MSG_ERROR, "Incompatible operands for %s comparison", Operator == TK_Eq ? "==" : Operator == TK_Neq ? "!=" : "~==");
	delete this;
	return nullptr;
}